

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

unique_ptr<Descriptor,_std::default_delete<Descriptor>_> __thiscall
wallet::GetDescriptor
          (wallet *this,CWallet *wallet,CCoinControl *coin_control,CScript *script_pubkey)

{
  _Rb_tree_header *p_Var1;
  _Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_> _Var2;
  _Base_ptr p_Var3;
  FlatSigningProvider *this_00;
  pointer __p;
  long in_FS_OFFSET;
  MultiSigningProvider providers;
  FlatSigningProvider *local_98;
  long *local_90;
  MultiSigningProvider local_88;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_68;
  __uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_> local_38;
  
  local_38._M_t.super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
  super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl =
       *(tuple<Descriptor_*,_std::default_delete<Descriptor>_> *)(in_FS_OFFSET + 0x28);
  local_88.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__MultiSigningProvider_00b04ac8;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CWallet::GetScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_68,wallet,script_pubkey);
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var3 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      (**(code **)(**(long **)(p_Var3 + 1) + 0xa8))(&local_90,*(long **)(p_Var3 + 1),script_pubkey);
      MultiSigningProvider::AddProvider
                (&local_88,
                 (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>)&local_90);
      if (local_90 != (long *)0x0) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_68);
  if (coin_control != (CCoinControl *)0x0) {
    this_00 = (FlatSigningProvider *)operator_new(0xf8);
    FlatSigningProvider::FlatSigningProvider(this_00,&coin_control->m_external_provider);
    local_68._M_impl._0_8_ = (FlatSigningProvider *)0x0;
    local_98 = this_00;
    MultiSigningProvider::AddProvider
              (&local_88,
               (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>)&local_98);
    if (local_98 != (FlatSigningProvider *)0x0) {
      (*(local_98->super_SigningProvider)._vptr_SigningProvider[1])();
      local_98 = (FlatSigningProvider *)0x0;
      if ((FlatSigningProvider *)local_68._M_impl._0_8_ != (FlatSigningProvider *)0x0) {
        std::default_delete<FlatSigningProvider>::operator()
                  ((default_delete<FlatSigningProvider> *)&local_68,
                   (FlatSigningProvider *)local_68._M_impl._0_8_);
      }
    }
  }
  InferDescriptor((CScript *)this,(SigningProvider *)script_pubkey);
  local_88.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__MultiSigningProvider_00b04ac8;
  std::
  vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ::~vector(&local_88.m_providers);
  _Var2.super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl =
       ((_Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_> *)(in_FS_OFFSET + 0x28))->
       super__Head_base<0UL,_Descriptor_*,_false>;
  if (_Var2.super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl ==
      (_Head_base<0UL,_Descriptor_*,_false>)
      local_38._M_t.super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
      super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl) {
    return (__uniq_ptr_data<Descriptor,_std::default_delete<Descriptor>,_true,_true>)
           (tuple<Descriptor_*,_std::default_delete<Descriptor>_>)
           _Var2.super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<Descriptor> GetDescriptor(const CWallet* wallet, const CCoinControl* coin_control,
                                                 const CScript script_pubkey)
{
    MultiSigningProvider providers;
    for (const auto spkman: wallet->GetScriptPubKeyMans(script_pubkey)) {
        providers.AddProvider(spkman->GetSolvingProvider(script_pubkey));
    }
    if (coin_control) {
        providers.AddProvider(std::make_unique<FlatSigningProvider>(coin_control->m_external_provider));
    }
    return InferDescriptor(script_pubkey, providers);
}